

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_analysis.cpp
# Opt level: O0

loop_terminator * __thiscall
loop_variable_state::insert(loop_variable_state *this,ir_if *if_stmt,bool continue_from_then)

{
  void *mem_ctx_00;
  loop_terminator *this_00;
  loop_terminator *t;
  void *mem_ctx;
  bool continue_from_then_local;
  ir_if *if_stmt_local;
  loop_variable_state *this_local;
  
  mem_ctx_00 = ralloc_parent(this);
  this_00 = (loop_terminator *)exec_node::operator_new(0x20,mem_ctx_00);
  loop_terminator::loop_terminator(this_00);
  this_00->ir = if_stmt;
  this_00->continue_from_then = continue_from_then;
  exec_list::push_tail(&this->terminators,(exec_node *)this_00);
  return this_00;
}

Assistant:

loop_terminator *
loop_variable_state::insert(ir_if *if_stmt, bool continue_from_then)
{
   void *mem_ctx = ralloc_parent(this);
   loop_terminator *t = new(mem_ctx) loop_terminator();

   t->ir = if_stmt;
   t->continue_from_then = continue_from_then;

   this->terminators.push_tail(t);

   return t;
}